

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

bool i4_is_prime(int n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  if (n < 1) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (3 < (uint)n) {
      uVar3 = 2;
      do {
        bVar1 = (int)SQRT((double)n) < (int)uVar3;
        if ((int)SQRT((double)n) < (int)uVar3) {
          return bVar1;
        }
        uVar2 = (uint)n % uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar2 != 0);
    }
  }
  return bVar1;
}

Assistant:

bool i4_is_prime ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_IS_PRIME reports whether an I4 is prime.
//
//  Method:
//
//    A simple, unoptimized sieve of Erasthosthenes is used to
//    check whether N can be divided by any integer between 2
//    and SQRT(N).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be tested.
//
//    Output, bool I4_IS_PRIME, is TRUE if N is prime, and FALSE
//    otherwise.  Note that negative numbers and 0 are not
//    considered prime.
//
{
  int i;
  int nhi;

  if ( n <= 0 )
  {
    return false;
  }

  if ( n <= 3 )
  {
    return true;
  }

  nhi = int( sqrt ( double(n) ) );

  for ( i = 2; i <= nhi; i++ )
  {
    if ( ( n % i ) == 0 )
    {
      return false;
    }
  }

  return true;
}